

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vertexClustering.cpp
# Opt level: O1

bool __thiscall
VertexClustering::localEnergyRelease
          (VertexClustering *this,VCCluster *c1,VCCluster *c2,VCEdge *e,
          queue<VCEdge,_std::deque<VCEdge,_std::allocator<VCEdge>_>_> *q2,bool constrain)

{
  iterator *piVar1;
  _Elt_pointer pVVar2;
  bool bVar3;
  bool bVar4;
  VCFace *pVVar5;
  VCCluster *this_00;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double dVar6;
  double extraout_XMM0_Qa_03;
  double extraout_XMM0_Qa_04;
  double dVar7;
  double dVar8;
  double dVar9;
  
  if (c1->isNull == false) {
    if (c2->isNull == false) {
      (*c1->_vptr_VCCluster[4])(c1);
      (*c2->_vptr_VCCluster[4])(c2);
      (*c1->_vptr_VCCluster[5])(c1,e->f2);
      (*c2->_vptr_VCCluster[6])(c2,e->f2);
      dVar6 = extraout_XMM0_Qa_02 + extraout_XMM0_Qa_01;
      (*c1->_vptr_VCCluster[6])(c1,e->f1);
      this_00 = c2;
      (*c2->_vptr_VCCluster[5])(c2,e->f1);
      dVar7 = extraout_XMM0_Qa_04 + extraout_XMM0_Qa_03;
      if (constrain) {
        bVar3 = transferLeadsToDisconnect((VertexClustering *)this_00,c1,e->f1);
        bVar4 = transferLeadsToDisconnect((VertexClustering *)this_00,c2,e->f2);
        if (!bVar4) {
          dVar6 = 1.79769313486232e+308;
        }
        if (!bVar3) {
          dVar7 = 1.79769313486232e+308;
        }
      }
      dVar8 = dVar6;
      if (extraout_XMM0_Qa_00 + extraout_XMM0_Qa <= dVar6) {
        dVar8 = extraout_XMM0_Qa_00 + extraout_XMM0_Qa;
      }
      dVar9 = dVar7;
      if (dVar8 <= dVar7) {
        dVar9 = dVar8;
      }
      if ((dVar9 != dVar6) || (NAN(dVar9) || NAN(dVar6))) {
        if ((dVar9 != dVar7) || (NAN(dVar9) || NAN(dVar7))) {
          pVVar2 = (q2->c).super__Deque_base<VCEdge,_std::allocator<VCEdge>_>._M_impl.
                   super__Deque_impl_data._M_finish._M_cur;
          if (pVVar2 == (q2->c).super__Deque_base<VCEdge,_std::allocator<VCEdge>_>._M_impl.
                        super__Deque_impl_data._M_finish._M_last + -1) {
            std::deque<VCEdge,std::allocator<VCEdge>>::_M_push_back_aux<VCEdge_const&>
                      ((deque<VCEdge,std::allocator<VCEdge>> *)q2,e);
          }
          else {
            pVVar5 = e->f2;
            pVVar2->f1 = e->f1;
            pVVar2->f2 = pVVar5;
            piVar1 = &(q2->c).super__Deque_base<VCEdge,_std::allocator<VCEdge>_>._M_impl.
                      super__Deque_impl_data._M_finish;
            piVar1->_M_cur = piVar1->_M_cur + 1;
          }
          return false;
        }
        goto LAB_00115fcb;
      }
    }
    pVVar5 = e->f2;
    VCCluster::delItem(c2,pVVar5);
    VCCluster::addItem(c1,pVVar5);
    pVVar5 = e->f2;
  }
  else {
LAB_00115fcb:
    pVVar5 = e->f1;
    VCCluster::delItem(c1,pVVar5);
    VCCluster::addItem(c2,pVVar5);
    pVVar5 = e->f1;
  }
  pushNeighbors(this,pVVar5,e,q2);
  return true;
}

Assistant:

bool VertexClustering::localEnergyRelease(VCCluster* c1, VCCluster* c2, VCEdge& e, queue<VCEdge> *q2, bool constrain) {
	double L0, L1, L2;
	if (c1->isNull) goto localEnergyRelease_c1_c2;
	if (c2->isNull) goto localEnergyRelease_c2_c1;
	L0 = c1->energy() + c2->energy();
	L1 = c1->energyWithItem(e.f2) + c2->energyWithoutItem(e.f2);
	L2 = c1->energyWithoutItem(e.f1) + c2->energyWithItem(e.f1);
	double minEnergy;
	if (constrain) {
		bool c1_ok = transferLeadsToDisconnect(c1, e.f1);
		bool c2_ok = transferLeadsToDisconnect(c2, e.f2);
		if (!c2_ok) 
			L1 = numeric_limits<double>::max();
		if (!c1_ok) 
			L2 = numeric_limits<double>::max();
	}
	minEnergy = min(min(L0, L1), L2);
	if (minEnergy == L1) 
		goto localEnergyRelease_c2_c1;
	else if (minEnergy == L2) 
		goto localEnergyRelease_c1_c2;
	q2->push(e);
	return false;

localEnergyRelease_c2_c1:
	c2->giveItem(e.f2, c1);
	pushNeighbors(e.f2, e, q2);
	return true;
localEnergyRelease_c1_c2:
	c1->giveItem(e.f1, c2);
	pushNeighbors(e.f1, e, q2);
	return true;
}